

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall ctemplate::BaseArena::Reset(BaseArena *this)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  
  FreeBlocks(this);
  pcVar2 = this->first_blocks_[0].mem;
  this->freestart_ = pcVar2;
  sVar1 = this->first_blocks_[0].size;
  this->remaining_ = sVar1;
  this->last_alloc_ = (char *)0x0;
  (this->status_).bytes_allocated_ = this->block_size_;
  if (((ulong)pcVar2 & 7) != 0) {
    uVar3 = (ulong)(8 - ((uint)pcVar2 & 7));
    pcVar2 = pcVar2 + uVar3;
    this->freestart_ = pcVar2;
    this->remaining_ = sVar1 - uVar3;
  }
  this->freestart_when_empty_ = pcVar2;
  if (((ulong)pcVar2 & 7) == 0) {
    return;
  }
  __assert_fail("!(reinterpret_cast<uintptr_t>(freestart_)&(kDefaultAlignment-1))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                ,0xb2,"virtual void ctemplate::BaseArena::Reset()");
}

Assistant:

void BaseArena::Reset() {
  FreeBlocks();
  freestart_ = first_blocks_[0].mem;
  remaining_ = first_blocks_[0].size;
  last_alloc_ = NULL;

  ARENASET(status_.bytes_allocated_ = block_size_);

  // We do not know for sure whether or not the first block is aligned,
  // so we fix that right now.
  const int overage = reinterpret_cast<uintptr_t>(freestart_) &
                      (kDefaultAlignment-1);
  if (overage > 0) {
    const int waste = kDefaultAlignment - overage;
    freestart_ += waste;
    remaining_ -= waste;
  }
  freestart_when_empty_ = freestart_;
  assert(!(reinterpret_cast<uintptr_t>(freestart_)&(kDefaultAlignment-1)));
}